

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLRefInfo::isSerializable(XMLRefInfo *this)

{
  XMLRefInfo *this_local;
  
  return true;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}